

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

bool __thiscall
cmCTest::RunMakeCommand
          (cmCTest *this,string *command,string *output,int *retVal,char *dir,cmDuration timeout,
          ostream *ofs,Encoding encoding)

{
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> uVar1;
  int *piVar2;
  string *psVar3;
  bool bVar4;
  int fd;
  ostream *poVar5;
  cmUVProcessChainBuilder *this_00;
  uv_loop_t *ctx;
  uv_pipe_s *handle;
  uv_stream_t *stream;
  ulong uVar6;
  Status *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  pointer pbVar7;
  cmProcessOutput processOutput;
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> outputHandle;
  cmUVProcessChain chain;
  _Any_data __tmp;
  uv_pipe_ptr outputStream;
  string local_2c8 [32];
  size_type tick_len;
  int *local_2a0;
  pointer local_298;
  pointer local_290;
  ostream *local_288;
  string *local_280;
  char *local_278;
  size_type tick_line_len;
  size_type tick;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  cmUVProcessChainBuilder builder;
  ostringstream cmCTestLog_msg;
  string local_50;
  
  local_278 = dir;
  cmSystemTools::ParseArguments(&args,command);
  if (args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_298 = args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_290 = args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    output->_M_string_length = 0;
    *(output->_M_dataplus)._M_p = '\0';
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    std::operator<<((ostream *)&cmCTestLog_msg,"Run command:");
    std::__cxx11::stringbuf::str();
    local_2a0 = retVal;
    local_288 = ofs;
    local_280 = output;
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x444,(char *)builder.Stdio._M_elems[0],false);
    std::__cxx11::string::~string((string *)&builder);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    for (pbVar7 = args.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar7 != args.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar7 = pbVar7 + 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar5 = std::operator<<((ostream *)&cmCTestLog_msg," \"");
      poVar5 = std::operator<<(poVar5,(string *)pbVar7);
      std::operator<<(poVar5,"\"");
      std::__cxx11::stringbuf::str();
      Log(this,5,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
          ,0x446,(char *)builder.Stdio._M_elems[0],false);
      std::__cxx11::string::~string((string *)&builder);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    std::endl<char,std::char_traits<char>>((ostream *)&cmCTestLog_msg);
    std::__cxx11::stringbuf::str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x448,(char *)builder.Stdio._M_elems[0],false);
    std::__cxx11::string::~string((string *)&builder);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    cmUVProcessChainBuilder::cmUVProcessChainBuilder(&builder);
    this_00 = cmUVProcessChainBuilder::AddCommand(&builder,&args);
    cmUVProcessChainBuilder::SetMergedBuiltinStreams(this_00);
    if (local_278 != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,local_278,(allocator<char> *)&cmCTestLog_msg);
      cmUVProcessChainBuilder::SetWorkingDirectory(&builder,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)&chain);
    outputStream.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
    super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    outputStream.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
    super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ctx = cmUVProcessChain::GetLoop(&chain);
    ::cm::uv_pipe_ptr::init(&outputStream,(EVP_PKEY_CTX *)ctx);
    handle = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_
                       (&outputStream.super_uv_handle_ptr_<uv_pipe_s>);
    fd = cmUVProcessChain::OutputStream(&chain);
    uv_pipe_open(handle,fd);
    tick = 0;
    tick_len = 0x400;
    tick_line_len = 0x32;
    cmProcessOutput::cmProcessOutput(&processOutput,encoding,0x400);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"   Each . represents ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5," bytes of output\n    ");
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,3,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x45f,(char *)__tmp._M_unused._0_8_,false);
    std::__cxx11::string::~string((string *)__tmp._M_pod_data);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    stream = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_(&outputStream);
    std::make_unique<cmUVStreamReadHandle>();
    uVar1 = outputHandle;
    _cmCTestLog_msg = (void *)0x0;
    __tmp._M_unused._M_object = operator_new(0x38);
    psVar3 = local_280;
    poVar5 = local_288;
    *(cmCTest **)__tmp._M_unused._0_8_ = this;
    *(cmProcessOutput **)((long)__tmp._M_unused._0_8_ + 8) = &processOutput;
    *(string **)((long)__tmp._M_unused._0_8_ + 0x10) = local_280;
    *(size_type **)((long)__tmp._M_unused._0_8_ + 0x18) = &tick;
    *(size_type **)((long)__tmp._M_unused._0_8_ + 0x20) = &tick_len;
    *(size_type **)((long)__tmp._M_unused._0_8_ + 0x28) = &tick_line_len;
    *(ostream **)((long)__tmp._M_unused._0_8_ + 0x30) = local_288;
    __tmp._8_8_ = 0;
    _cmCTestLog_msg =
         *(undefined8 *)
          ((long)uVar1._M_t.
                 super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
                 .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl + 0x18);
    *(undefined8 *)
     ((long)uVar1._M_t.
            super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>.
            _M_t.
            super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
            .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl + 0x18) =
         __tmp._M_unused._M_object;
    *(undefined8 *)
     ((long)uVar1._M_t.
            super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>.
            _M_t.
            super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
            .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl + 0x20) = 0;
    *(code **)((long)uVar1._M_t.
                     super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
                     .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl + 0x28) =
         std::
         _Function_handler<void_(std::vector<char,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1122:5)>
         ::_M_manager;
    *(code **)((long)uVar1._M_t.
                     super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
                     .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl + 0x30) =
         std::
         _Function_handler<void_(std::vector<char,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1122:5)>
         ::_M_invoke;
    std::_Function_base::~_Function_base((_Function_base *)&cmCTestLog_msg);
    uVar1 = outputHandle;
    _cmCTestLog_msg = (void *)0x0;
    __tmp._M_unused._M_object = operator_new(0x20);
    *(cmCTest **)__tmp._M_unused._0_8_ = this;
    *(cmProcessOutput **)((long)__tmp._M_unused._0_8_ + 8) = &processOutput;
    *(string **)((long)__tmp._M_unused._0_8_ + 0x10) = psVar3;
    *(ostream **)((long)__tmp._M_unused._0_8_ + 0x18) = poVar5;
    __tmp._8_8_ = 0;
    _cmCTestLog_msg =
         *(undefined8 *)
          ((long)uVar1._M_t.
                 super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
                 .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl + 0x38);
    *(undefined8 *)
     ((long)uVar1._M_t.
            super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>.
            _M_t.
            super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
            .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl + 0x38) =
         __tmp._M_unused._M_object;
    *(undefined8 *)
     ((long)uVar1._M_t.
            super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>.
            _M_t.
            super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
            .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl + 0x40) = 0;
    *(code **)((long)uVar1._M_t.
                     super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
                     .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl + 0x48) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1147:5)>
         ::_M_manager;
    *(code **)((long)uVar1._M_t.
                     super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
                     .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl + 0x50) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1147:5)>
         ::_M_invoke;
    std::_Function_base::~_Function_base((_Function_base *)&cmCTestLog_msg);
    stream->data = (void *)outputHandle._M_t.
                           super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>
                           .super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl;
    uv_read_start(stream,cmUVStreamRead<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1122:5),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1147:5)>
                         ::anon_class_1_0_00000001::__invoke,
                  cmUVStreamRead<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1122:5),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx:1147:5)>
                  ::anon_class_1_0_00000001::__invoke);
    uVar6 = (ulong)(timeout.__r * 1000.0);
    bVar4 = cmUVProcessChain::Wait
                      (&chain,(long)(timeout.__r * 1000.0 - 9.223372036854776e+18) &
                              (long)uVar6 >> 0x3f | uVar6);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCTestLog_msg," Size of output: ");
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,(int)((((double)CONCAT44(0x45300000,
                                                        (int)(psVar3->_M_string_length >> 0x20)) -
                                      1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,(int)psVar3->_M_string_length) -
                                     4503599627370496.0)) * 0.0009765625));
    poVar5 = std::operator<<(poVar5,"K");
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::stringbuf::str();
    Log(this,3,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x48b,(char *)__tmp._M_unused._0_8_,false);
    std::__cxx11::string::~string((string *)__tmp._M_pod_data);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    if (bVar4) {
      this_01 = cmUVProcessChain::GetStatus(&chain,0);
      cmUVProcessChain::Status::GetException_abi_cxx11_
                ((pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&__tmp,this_01);
      piVar2 = local_2a0;
      if (__tmp._0_4_ == 0) {
        *local_2a0 = (int)this_01->ExitStatus;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"Command exited with the value: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,*piVar2);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::stringbuf::str();
        Log(this,5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
            ,0x494,(char *)local_2c8._0_8_,false);
      }
      else if (__tmp._0_4_ == 5) {
        std::__cxx11::string::append((char *)psVar3);
        std::__cxx11::string::append((string *)psVar3);
        std::__cxx11::string::append((char *)psVar3);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"There was an error: ");
        poVar5 = std::operator<<(poVar5,(string *)(__tmp._M_pod_data + 8));
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::stringbuf::str();
        Log(this,7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
            ,0x49b,(char *)local_2c8._0_8_,false);
      }
      else {
        *local_2a0 = __tmp._0_4_;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"There was an exception: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,*piVar2);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::stringbuf::str();
        Log(this,6,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
            ,0x4a0,(char *)local_2c8._0_8_,false);
      }
      std::__cxx11::string::~string(local_2c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)(__tmp._M_pod_data + 8));
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"There was a timeout");
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::stringbuf::str();
      Log(this,6,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
          ,0x4a4,(char *)__tmp._M_unused._0_8_,false);
      std::__cxx11::string::~string((string *)__tmp._M_pod_data);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    }
    std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::~unique_ptr
              (&outputHandle);
    ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_
              ((uv_handle_ptr_base_<uv_pipe_s> *)&outputStream);
    cmUVProcessChain::~cmUVProcessChain(&chain);
    cmUVProcessChainBuilder::~cmUVProcessChainBuilder(&builder);
    args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_290;
    args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = local_298;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  return args.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         args.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool cmCTest::RunMakeCommand(const std::string& command, std::string& output,
                             int* retVal, const char* dir, cmDuration timeout,
                             std::ostream& ofs, Encoding encoding)
{
  // First generate the command and arguments
  std::vector<std::string> args = cmSystemTools::ParseArguments(command);

  if (args.empty()) {
    return false;
  }

  output.clear();
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, "Run command:");
  for (auto const& arg : args) {
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, " \"" << arg << "\"");
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, std::endl);

  // Now create process object
  cmUVProcessChainBuilder builder;
  builder.AddCommand(args).SetMergedBuiltinStreams();
  if (dir) {
    builder.SetWorkingDirectory(dir);
  }
  auto chain = builder.Start();
  cm::uv_pipe_ptr outputStream;
  outputStream.init(chain.GetLoop(), 0);
  uv_pipe_open(outputStream, chain.OutputStream());

  // Initialize tick's
  std::string::size_type tick = 0;
  std::string::size_type tick_len = 1024;
  std::string::size_type tick_line_len = 50;

  cmProcessOutput processOutput(encoding);
  cmCTestLog(this, HANDLER_PROGRESS_OUTPUT,
             "   Each . represents " << tick_len
                                     << " bytes of output\n"
                                        "    "
                                     << std::flush);
  auto outputHandle = cmUVStreamRead(
    outputStream,
    [this, &processOutput, &output, &tick, &tick_len, &tick_line_len,
     &ofs](std::vector<char> data) {
      std::string strdata;
      processOutput.DecodeText(data.data(), data.size(), strdata);
      for (char& cc : strdata) {
        if (cc == 0) {
          cc = '\n';
        }
      }
      output.append(strdata);
      while (output.size() > (tick * tick_len)) {
        tick++;
        cmCTestLog(this, HANDLER_PROGRESS_OUTPUT, "." << std::flush);
        if (tick % tick_line_len == 0 && tick > 0) {
          cmCTestLog(this, HANDLER_PROGRESS_OUTPUT,
                     "  Size: " << int((double(output.size()) / 1024.0) + 1)
                                << "K\n    " << std::flush);
        }
      }
      cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                 cmCTestLogWrite(strdata.c_str(), strdata.size()));
      if (ofs) {
        ofs << cmCTestLogWrite(strdata.c_str(), strdata.size());
      }
    },
    [this, &processOutput, &output, &ofs]() {
      std::string strdata;
      processOutput.DecodeText(std::string(), strdata);
      if (!strdata.empty()) {
        output.append(strdata);
        cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                   cmCTestLogWrite(strdata.c_str(), strdata.size()));
        if (ofs) {
          ofs << cmCTestLogWrite(strdata.c_str(), strdata.size());
        }
      }
    });

  bool finished = chain.Wait(static_cast<uint64_t>(timeout.count() * 1000.0));
  cmCTestLog(this, HANDLER_PROGRESS_OUTPUT,
             " Size of output: " << int(double(output.size()) / 1024.0) << "K"
                                 << std::endl);

  if (finished) {
    auto const& status = chain.GetStatus(0);
    auto exception = status.GetException();
    switch (exception.first) {
      case cmUVProcessChain::ExceptionCode::None:
        *retVal = static_cast<int>(status.ExitStatus);
        cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                   "Command exited with the value: " << *retVal << std::endl);
        break;
      case cmUVProcessChain::ExceptionCode::Spawn:
        output += "\n*** ERROR executing: ";
        output += exception.second;
        output += "\n***The build process failed.";
        cmCTestLog(this, ERROR_MESSAGE,
                   "There was an error: " << exception.second << std::endl);
        break;
      default:
        *retVal = static_cast<int>(exception.first);
        cmCTestLog(this, WARNING,
                   "There was an exception: " << *retVal << std::endl);
        break;
    }
  } else {
    cmCTestLog(this, WARNING, "There was a timeout" << std::endl);
  }

  return true;
}